

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

JSON * phosg::JSON::parse(JSON *__return_storage_ptr__,char *s,size_t size,bool disable_extensions)

{
  bool bVar1;
  parse_error *this;
  StringReader r;
  string local_78;
  StringReader local_58;
  
  StringReader::StringReader(&local_58,s,size,0);
  parse(__return_storage_ptr__,&local_58,disable_extensions);
  skip_whitespace_and_comments(&local_58,disable_extensions);
  bVar1 = StringReader::eof(&local_58);
  if (bVar1) {
    local_58._vptr_StringReader = (_func_int **)&PTR__StringReader_0012ac80;
    if (local_58.owned_data.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.owned_data.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return __return_storage_ptr__;
  }
  this = (parse_error *)__cxa_allocate_exception(0x10);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"unparsed data remains after value","");
  parse_error::parse_error(this,&local_78);
  __cxa_throw(this,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

JSON JSON::parse(const char* s, size_t size, bool disable_extensions) {
  StringReader r(s, size);
  auto ret = JSON::parse(r, disable_extensions);
  skip_whitespace_and_comments(r, disable_extensions);
  if (!r.eof()) {
    throw parse_error("unparsed data remains after value");
  }
  return ret;
}